

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_odd_multiples_table_globalz_windowa
               (secp256k1_ge *pre,secp256k1_fe *globalz,secp256k1_gej *a)

{
  undefined1 local_568 [8];
  secp256k1_fe zr [8];
  secp256k1_gej prej [8];
  secp256k1_gej *a_local;
  secp256k1_fe *globalz_local;
  secp256k1_ge *pre_local;
  
  secp256k1_ecmult_odd_multiples_table(8,(secp256k1_gej *)(zr[7].n + 4),(secp256k1_fe *)local_568,a)
  ;
  secp256k1_ge_globalz_set_table_gej
            (8,pre,globalz,(secp256k1_gej *)(zr[7].n + 4),(secp256k1_fe *)local_568);
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table_globalz_windowa(secp256k1_ge *pre, secp256k1_fe *globalz, const secp256k1_gej *a) {
    secp256k1_gej prej[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_fe zr[ECMULT_TABLE_SIZE(WINDOW_A)];

    /* Compute the odd multiples in Jacobian form. */
    secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), prej, zr, a);
    /* Bring them to the same Z denominator. */
    secp256k1_ge_globalz_set_table_gej(ECMULT_TABLE_SIZE(WINDOW_A), pre, globalz, prej, zr);
}